

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

FuncVec * __thiscall
dg::llvmdg::LazyLLVMCallGraph::getCalledFunctions(LazyLLVMCallGraph *this,CallInst *C)

{
  HashMap<const_llvm::CallInst_*,_FuncVec> *this_00;
  int iVar1;
  pointer ppFVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  FuncVec *pFVar5;
  Function *fun;
  CallInst *local_48;
  _Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_40;
  Function *local_28;
  
  local_48 = C;
  ppFVar2 = (pointer)llvm::Value::stripPointerCasts();
  local_40._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (*(char *)(ppFVar2 + 2) == '\0') {
    local_40._M_impl.super__Vector_impl_data._M_start = ppFVar2;
  }
  if (local_40._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    this_00 = &this->_funptrs;
    iVar3 = std::
            _Hashtable<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this_00,&local_48);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      _getCalledFunctions((FuncVec *)&local_40,this,local_48);
      pmVar4 = std::__detail::
               _Map_base<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_48);
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::_M_move_assign
                (pmVar4,&local_40);
      std::_Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::
      ~_Vector_base(&local_40);
      pFVar5 = std::__detail::
               _Map_base<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_48);
    }
    else {
      pFVar5 = (FuncVec *)
               ((long)iVar3.
                      super__Node_iterator_base<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_false>
                      ._M_cur + 0x10);
    }
  }
  else {
    if (getCalledFunctions(llvm::CallInst_const*)::retval == '\0') {
      iVar1 = __cxa_guard_acquire(&getCalledFunctions(llvm::CallInst_const*)::retval);
      if (iVar1 != 0) {
        getCalledFunctions::retval.
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        getCalledFunctions::retval.
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        getCalledFunctions::retval.
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        __cxa_atexit(std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::
                     ~vector,&getCalledFunctions::retval,&__dso_handle);
        __cxa_guard_release(&getCalledFunctions(llvm::CallInst_const*)::retval);
      }
    }
    if (getCalledFunctions::retval.
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        getCalledFunctions::retval.
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      getCalledFunctions::retval.
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           getCalledFunctions::retval.
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    pFVar5 = &getCalledFunctions::retval;
    std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
              (&getCalledFunctions::retval,(value_type *)&local_40);
    local_28 = *(Function **)(*(long *)(local_48 + 0x28) + 0x38);
    GenericCallGraph<const_llvm::Function_*>::addCall(&this->_cg,&local_28,(Function **)&local_40);
  }
  return pFVar5;
}

Assistant:

const FuncVec &getCalledFunctions(const llvm::CallInst *C) {
        auto *val = _getCalledValue(C);
        if (auto *fun = llvm::dyn_cast<llvm::Function>(val)) {
            static FuncVec retval;
            retval.clear();
            retval.push_back(fun);
            _cg.addCall(C->getParent()->getParent(), fun);
            return retval;
        }

        auto it = _funptrs.find(C);
        if (it != _funptrs.end()) {
            return it->second;
        }

        // FIXME: do not do multiple lookups
        _funptrs[C] = _getCalledFunctions(C);
        return _funptrs[C];
    }